

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_matrix_stride_msl
          (CompilerMSL *this,SPIRType *type,bool packed,bool row_major)

{
  uint32_t local_38;
  bool row_major_local;
  bool packed_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  if (packed) {
    if ((row_major) && (1 < type->columns)) {
      local_38 = type->columns;
    }
    else {
      local_38 = type->vecsize;
    }
    this_local._4_4_ = (type->width >> 3) * local_38;
  }
  else {
    this_local._4_4_ = get_declared_type_alignment_msl(this,type,false,row_major);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_matrix_stride_msl(const SPIRType &type, bool packed, bool row_major) const
{
	// For packed matrices, we just use the size of the vector type.
	// Otherwise, MatrixStride == alignment, which is the size of the underlying vector type.
	if (packed)
		return (type.width / 8) * ((row_major && type.columns > 1) ? type.columns : type.vecsize);
	else
		return get_declared_type_alignment_msl(type, false, row_major);
}